

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_133::
     genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>(Reader reader)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  Reader reader_06;
  Reader reader_07;
  Reader reader_08;
  Reader reader_09;
  Reader reader_10;
  Reader reader_11;
  Reader reader_12;
  Reader reader_13;
  Reader reader_14;
  Reader reader_15;
  Reader reader_16;
  Reader reader_17;
  Reader reader_18;
  Reader reader_19;
  Reader reader_20;
  Reader reader_21;
  Reader reader_22;
  Reader reader_23;
  Reader reader_24;
  Reader reader_25;
  Reader reader_26;
  ArrayPtr<const_char> AVar1;
  CapTableReader *pCVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  unsigned_short uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char *pcVar17;
  WirePointer WVar18;
  WirePointer WVar19;
  undefined1 auVar20 [8];
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  uint32_t uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  byte *b;
  bool bVar29;
  char cVar30;
  short sVar31;
  WirePointer *pWVar32;
  int iVar33;
  float fVar34;
  uint uVar35;
  WireValue<uint32_t> WVar36;
  undefined4 uVar37;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar38;
  float fVar39;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar40;
  float fVar41;
  double dVar42;
  double dVar43;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_25;
  float in_stack_00000008;
  uint in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  byte *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  DebugComparison<bool,_bool> _kjCondition;
  Reader subReader;
  DebugExpression<bool> _kjCondition_9;
  DebugExpression<bool> _kjCondition_21;
  undefined1 local_648 [8];
  WirePointer WStack_640;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  undefined8 local_628;
  size_t sStack_620;
  bool local_618;
  undefined1 local_608 [8];
  WirePointer WStack_600;
  WirePointer *local_5f8;
  WirePointer *local_5f0;
  uint local_5e8;
  ushort local_5e4;
  int local_5e0;
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  WirePointer *local_5c8;
  int local_5c0;
  undefined4 uStack_5bc;
  StructPointerCount local_5b4;
  int local_5b0;
  char *local_5a0;
  StructReader local_598;
  PointerReader local_568;
  ListReader local_540;
  ListReader local_510;
  ListReader local_4e0;
  ListReader local_4b0;
  ListReader local_480;
  ListReader local_450;
  ListReader local_420;
  ListReader local_3f0;
  ListReader local_3c0;
  ListReader local_390;
  ListReader local_360;
  ListReader local_330;
  ListReader local_300;
  ListReader local_2d0;
  ListReader local_2a0;
  ListReader local_270;
  ListReader local_240;
  ListReader local_210;
  ListReader local_1e0;
  ListReader local_1b0;
  ListReader local_180;
  ListReader local_150;
  ListReader local_120;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  ListReader local_60;
  
  local_568.capTable = (CapTableReader *)local_568.segment;
  uStack_630._1_7_ = local_638._1_7_;
  uVar7 = in_stack_00000028;
  if (in_stack_00000028 == 0) {
    local_648._0_2_ = 1;
    _local_638 = (unkuint9)5;
    if (kj::_::Debug::minSeverity < 3) {
      bVar3 = 0;
      goto LAB_001cf2fc;
    }
    uVar7 = 0;
LAB_001cf355:
    bVar29 = true;
    bVar3 = 0;
  }
  else {
    bVar29 = (bool)(*in_stack_00000018 & 1);
    local_648 = (undefined1  [8])
                (CONCAT62(local_648._2_6_,CONCAT11(*in_stack_00000018,1)) & 0xffffffffffff01ff);
    uStack_630._0_1_ = bVar29;
    local_638 = (undefined1  [8])&DAT_00000005;
    if ((bVar29 == false) && (kj::_::Debug::minSeverity < 3)) {
      bVar3 = *in_stack_00000018 & 1;
LAB_001cf2fc:
      local_608[0] = 1;
      WStack_640 = (WirePointer)0x28e598;
      local_5d8[0] = bVar3;
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(true) == (reader.getBoolField())\", _kjCondition, true, reader.getBoolField()"
                 ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_648,(bool *)local_608,(bool *)local_5d8);
    }
    if (in_stack_00000028 < 0x10) goto LAB_001cf355;
    bVar3 = in_stack_00000018[1];
    bVar29 = false;
  }
  local_648[4] = bVar3;
  local_648._0_4_ = 0xffffff85;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = bVar3 == 0x85;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((bVar3 != 0x85) && (kj::_::Debug::minSeverity < 3)) {
    local_608._0_4_ = 0xffffff85;
    if (bVar29) {
      bVar3 = 0;
    }
    else {
      bVar3 = in_stack_00000018[1];
    }
    local_5d8[0] = bVar3;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdd,ERROR,
               "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", _kjCondition, -123, reader.getInt8Field()"
               ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_648,(int *)local_608,local_5d8);
    uVar7 = in_stack_00000028;
  }
  if (uVar7 < 0x20) {
    sVar31 = 0;
  }
  else {
    sVar31 = *(short *)(in_stack_00000018 + 2);
  }
  local_648._4_2_ = sVar31;
  local_648._0_4_ = 0xffffcfc7;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = sVar31 == -0x3039;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((sVar31 != -0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_608._0_4_ = 0xffffcfc7;
    if (uVar7 < 0x20) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined2 *)(in_stack_00000018 + 2);
    }
    local_5d8._0_2_ = uVar5;
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xde,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", _kjCondition, -12345, reader.getInt16Field()"
               ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",
               (DebugComparison<int,_short> *)local_648,(int *)local_608,(short *)local_5d8);
    uVar7 = in_stack_00000028;
  }
  local_648._4_4_ = 0;
  if (0x3f < uVar7) {
    local_648._4_4_ = *(undefined4 *)(in_stack_00000018 + 4);
  }
  local_648._0_4_ = 0xff439eb2;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = local_648._4_4_ == -0xbc614e;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((local_648._4_4_ != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    uVar21 = 0;
    local_608._0_4_ = 0xff439eb2;
    if (0x3f < uVar7) {
      uVar21 = *(undefined4 *)(in_stack_00000018 + 4);
    }
    local_5d8._0_4_ = uVar21;
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", _kjCondition, -12345678, reader.getInt32Field()"
               ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
               (DebugComparison<int,_int> *)local_648,(int *)local_608,(int *)local_5d8);
    uVar7 = in_stack_00000028;
  }
  if (uVar7 < 0x80) {
    WStack_640 = (WirePointer)0x0;
  }
  else {
    WStack_640 = *(WirePointer *)(in_stack_00000018 + 8);
  }
  local_648 = (undefined1  [8])0xffff8fb779f22087;
  local_638 = (undefined1  [8])0x28e598;
  uStack_630 = (WirePointer *)&DAT_00000005;
  local_628 = (char *)CONCAT71(local_628._1_7_,WStack_640 == (WirePointer)0xffff8fb779f22087);
  pWVar32 = (WirePointer *)0x0;
  if ((WStack_640 != (WirePointer)0xffff8fb779f22087) && (kj::_::Debug::minSeverity < 3)) {
    local_608 = (undefined1  [8])0xffff8fb779f22087;
    if (uVar7 < 0x80) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = *(char **)(in_stack_00000018 + 8);
    }
    local_5d8 = (undefined1  [8])pcVar17;
    kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", _kjCondition, -123456789012345ll, reader.getInt64Field()"
               ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_648,(longlong *)local_608,(long *)local_5d8
              );
    uVar7 = in_stack_00000028;
    pWVar32 = uStack_630;
  }
  uStack_630 = pWVar32;
  if (uVar7 < 0x88) {
    bVar3 = 0;
  }
  else {
    bVar3 = in_stack_00000018[0x10];
  }
  local_648[4] = bVar3;
  local_648._0_4_ = 0xea;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = bVar3 == 0xea;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((bVar3 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_608._0_4_ = 0xea;
    if (uVar7 < 0x88) {
      bVar3 = 0;
    }
    else {
      bVar3 = in_stack_00000018[0x10];
    }
    local_5d8[0] = bVar3;
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", _kjCondition, 234u, reader.getUInt8Field()"
               ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_648,(uint *)local_608,local_5d8
              );
    uVar7 = in_stack_00000028;
  }
  if (uVar7 < 0xa0) {
    sVar31 = 0;
  }
  else {
    sVar31 = *(short *)(in_stack_00000018 + 0x12);
  }
  local_648._4_2_ = sVar31;
  local_648._0_4_ = 0xb26e;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = sVar31 == -0x4d92;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((sVar31 != -0x4d92) && (kj::_::Debug::minSeverity < 3)) {
    local_608._0_4_ = 0xb26e;
    if (uVar7 < 0xa0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined2 *)(in_stack_00000018 + 0x12);
    }
    local_5d8._0_2_ = uVar5;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", _kjCondition, 45678u, reader.getUInt16Field()"
               ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_648,(uint *)local_608,
               (unsigned_short *)local_5d8);
    uVar7 = in_stack_00000028;
  }
  local_648._4_4_ = 0;
  if (0xbf < uVar7) {
    local_648._4_4_ = *(undefined4 *)(in_stack_00000018 + 0x14);
  }
  local_648._0_4_ = 0xce0a6a14;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = local_648._4_4_ == -0x31f595ec;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((local_648._4_4_ != -0x31f595ec) && (kj::_::Debug::minSeverity < 3)) {
    uVar21 = 0;
    local_608._0_4_ = 0xce0a6a14;
    if (0xbf < uVar7) {
      uVar21 = *(undefined4 *)(in_stack_00000018 + 0x14);
    }
    local_5d8._0_4_ = uVar21;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe3,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", _kjCondition, 3456789012u, reader.getUInt32Field()"
               ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_648,(uint *)local_608,
               (uint *)local_5d8);
    uVar7 = in_stack_00000028;
  }
  if (uVar7 < 0x100) {
    WStack_640 = (WirePointer)0x0;
  }
  else {
    WStack_640 = *(WirePointer *)(in_stack_00000018 + 0x18);
  }
  local_648 = (undefined1  [8])0xab54a98ceb1f0ad2;
  uStack_630 = (WirePointer *)0x5;
  local_638 = (undefined1  [8])" == ";
  local_628 = (char *)CONCAT71(local_628._1_7_,WStack_640 == (WirePointer)0xab54a98ceb1f0ad2);
  if ((WStack_640 != (WirePointer)0xab54a98ceb1f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_608 = (undefined1  [8])0xab54a98ceb1f0ad2;
    if (uVar7 < 0x100) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = *(char **)(in_stack_00000018 + 0x18);
    }
    local_5d8 = (undefined1  [8])pcVar17;
    kj::_::Debug::
    log<char_const(&)[72],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", _kjCondition, 12345678901234567890ull, reader.getUInt64Field()"
               ,(char (*) [72])
                "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_648,
               (unsigned_long_long *)local_608,(unsigned_long *)local_5d8);
    uVar7 = in_stack_00000028;
  }
  fVar34 = 0.0;
  if (uVar7 < 0x120) {
LAB_001cf876:
    fVar39 = fVar34 + -1234.5;
    fVar41 = -fVar39;
    if (-fVar39 <= fVar39) {
      fVar41 = fVar39;
    }
    fVar39 = -fVar34;
    if (-fVar34 <= fVar34) {
      fVar39 = fVar34;
    }
    fVar34 = (fVar39 + 1234.5) * 1e-05;
    local_5d8[0] = fVar41 < fVar34;
    if ((fVar34 <= fVar41) && (kj::_::Debug::minSeverity < 3)) {
      uVar21 = 0;
      if (0x11f < uVar7) {
        uVar21 = *(undefined4 *)(in_stack_00000018 + 0x20);
      }
      local_648._0_4_ = uVar21;
      local_608._0_4_ = 0x449a5000;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", _kjCondition, reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 (DebugExpression<bool> *)local_5d8,(float *)local_648,(float *)local_608);
      uVar7 = in_stack_00000028;
    }
  }
  else {
    fVar34 = *(float *)(in_stack_00000018 + 0x20);
    if ((fVar34 != 1234.5) || (NAN(fVar34))) goto LAB_001cf876;
  }
  pCVar2 = uStack_5d0;
  uVar21 = 0;
  uVar37 = 0;
  if (uVar7 < 0x180) {
LAB_001cf955:
    dVar42 = (double)CONCAT44(uVar37,uVar21) + 1.23e+47;
    dVar43 = -dVar42;
    if (-dVar42 <= dVar42) {
      dVar43 = dVar42;
    }
    dVar42 = -(double)CONCAT44(uVar37,uVar21);
    if (dVar42 <= (double)CONCAT44(uVar37,uVar21)) {
      dVar42 = (double)CONCAT44(uVar37,uVar21);
    }
    dVar42 = (dVar42 + 1.23e+47) * 1e-12;
    local_5d8[0] = dVar43 < dVar42;
    if ((dVar42 <= dVar43) && (kj::_::Debug::minSeverity < 3)) {
      uVar21 = 0;
      uVar37 = 0;
      if (0x17f < uVar7) {
        uVar21 = (undefined4)*(undefined8 *)(in_stack_00000018 + 0x28);
        uVar37 = (undefined4)((ulong)*(undefined8 *)(in_stack_00000018 + 0x28) >> 0x20);
      }
      local_648 = (undefined1  [8])CONCAT44(uVar37,uVar21);
      local_608 = (undefined1  [8])0xc9b58b82c0e0bb00;
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", _kjCondition, reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 (DebugExpression<bool> *)local_5d8,(double *)local_648,(double *)local_608);
      pCVar2 = uStack_5d0;
    }
  }
  else {
    dVar42 = *(double *)(in_stack_00000018 + 0x28);
    uVar21 = SUB84(dVar42,0);
    uVar37 = (undefined4)((ulong)dVar42 >> 0x20);
    if ((dVar42 != -1.23e+47) || (NAN(dVar42))) goto LAB_001cf955;
  }
  uStack_5d0 = pCVar2;
  local_5d8 = (undefined1  [8])"foo";
  bVar29 = in_stack_0000002c == 0;
  local_638 = (undefined1  [8])in_stack_00000020;
  if (bVar29) {
    local_638 = (undefined1  [8])(WirePointer *)0x0;
  }
  uVar21._0_1_ = true;
  uVar21._1_1_ = true;
  uVar21._2_2_ = 0x7fff;
  if (!bVar29) {
    uVar21 = _kjCondition._0_4_;
  }
  local_648._0_4_ = 0.0;
  local_648._4_4_ = 0;
  WStack_640.offsetAndKind.value = 0;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (!bVar29) {
    local_648._0_4_ = in_stack_00000008;
    local_648._4_4_ = in_stack_0000000c;
    WStack_640.offsetAndKind.value = in_stack_00000010;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  _local_608 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)local_648,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_648,
             (DebugExpression<char_const(&)[4]> *)local_5d8,(Reader *)local_608);
  if ((sStack_620._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    bVar29 = in_stack_0000002c == 0;
    local_5f8 = in_stack_00000020;
    if (bVar29) {
      local_5f8 = (WirePointer *)0x0;
    }
    uVar37._0_1_ = true;
    uVar37._1_1_ = true;
    uVar37._2_2_ = 0x7fff;
    if (!bVar29) {
      uVar37 = _kjCondition._0_4_;
    }
    local_608._0_4_ = 0.0;
    local_608._4_4_ = 0;
    WStack_600.offsetAndKind.value = 0;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_608._0_4_ = in_stack_00000008;
      local_608._4_4_ = in_stack_0000000c;
      WStack_600.offsetAndKind.value = in_stack_00000010;
      WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
    }
    local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,uVar37);
    _local_608 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", _kjCondition, \"foo\", reader.getTextField()"
               ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_648,
               (char (*) [4])"foo",(Reader *)local_608);
  }
  pWVar32 = (WirePointer *)0x0;
  local_638 = (undefined1  [8])(in_stack_00000020 + 1);
  if (in_stack_0000002c < 2) {
    local_638 = (undefined1  [8])pWVar32;
  }
  uVar22._0_1_ = true;
  uVar22._1_1_ = true;
  uVar22._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 2) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    uVar21 = uVar22;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  _local_638 = (ArrayPtr<const_unsigned_char>)
               PointerReader::getBlob<capnp::Data>((PointerReader *)local_648,(void *)0x0,0);
  if (uStack_630 == (WirePointer *)0x3) {
    pWVar32 = (WirePointer *)
              (ulong)((char)*(short *)((long)local_638 + 2) == 'r' && *(short *)local_638 == 0x6162)
    ;
  }
  local_648 = (undefined1  [8])0x28e857;
  WStack_640 = (WirePointer)0x3;
  local_628 = " == ";
  sStack_620 = 5;
  local_618 = SUB81(pWVar32,0);
  if ((local_618 == false) && (kj::_::Debug::minSeverity < 3)) {
    uStack_5d0 = (CapTableReader *)0x3;
    local_5d8 = (undefined1  [8])"bar";
    local_5f8 = in_stack_00000020 + 1;
    if (in_stack_0000002c < 2) {
      local_5f8 = (WirePointer *)0x0;
    }
    uVar23._0_1_ = true;
    uVar23._1_1_ = true;
    uVar23._2_2_ = 0x7fff;
    local_608._0_4_ = in_stack_00000008;
    local_608._4_4_ = in_stack_0000000c;
    WStack_600.offsetAndKind.value = in_stack_00000010;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
    uVar21 = _kjCondition._0_4_;
    if (in_stack_0000002c < 2) {
      local_608._0_4_ = 0.0;
      local_608._4_4_ = 0;
      WStack_600.offsetAndKind.value = 0;
      WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      uVar21 = uVar23;
    }
    local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,uVar21);
    _local_608 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Data>((PointerReader *)local_608,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", _kjCondition, data(\"bar\"), reader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_648,
               (Reader *)local_5d8,(Reader *)local_608);
  }
  local_638 = (undefined1  [8])(in_stack_00000020 + 2);
  if (in_stack_0000002c < 3) {
    local_638 = (undefined1  [8])(WirePointer *)0x0;
  }
  uVar24._0_1_ = true;
  uVar24._1_1_ = true;
  uVar24._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 3) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    uVar21 = uVar24;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getStruct((StructReader *)local_608,(PointerReader *)local_648,(word *)0x0);
  if (local_5e8 == 0) {
    local_648._0_2_ = 1;
    _local_638 = (unkuint9)5;
    if (kj::_::Debug::minSeverity < 3) {
      bVar3 = 0;
      goto LAB_001cfd16;
    }
    uVar7 = 0;
LAB_001cfd6f:
    bVar29 = true;
    cVar30 = '\0';
  }
  else {
    bVar3 = (byte)(local_5f8->offsetAndKind).value;
    bVar29 = (bool)(bVar3 & 1);
    local_648 = (undefined1  [8])(CONCAT62(local_648._2_6_,CONCAT11(bVar3,1)) & 0xffffffffffff01ff);
    uStack_630._0_1_ = bVar29;
    local_638 = (undefined1  [8])&DAT_00000005;
    if ((bVar29 == false) && (kj::_::Debug::minSeverity < 3)) {
      bVar3 = (byte)(local_5f8->offsetAndKind).value & 1;
LAB_001cfd16:
      local_5d8[0] = 1;
      WStack_640 = (WirePointer)0x28e598;
      local_598.segment._0_1_ = bVar3;
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.getBoolField())\", _kjCondition, true, subReader.getBoolField()"
                 ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_648,(bool *)local_5d8,(bool *)&local_598);
    }
    uVar7 = local_5e8;
    if (local_5e8 < 0x10) goto LAB_001cfd6f;
    cVar30 = *(char *)((long)&(local_5f8->offsetAndKind).value + 1);
    bVar29 = false;
  }
  local_648[4] = cVar30;
  local_648._0_4_ = 0xfffffff4;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = cVar30 == -0xc;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((cVar30 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8._0_4_ = 0xfffffff4;
    if (bVar29) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined1 *)((long)&(local_5f8->offsetAndKind).value + 1);
    }
    local_598.segment._0_1_ = uVar4;
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", _kjCondition, -12, subReader.getInt8Field()"
               ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_648,(int *)local_5d8,(char *)&local_598);
    uVar7 = local_5e8;
  }
  if (uVar7 < 0x20) {
    sVar31 = 0;
  }
  else {
    sVar31 = *(short *)((long)&(local_5f8->offsetAndKind).value + 2);
  }
  local_648._4_2_ = sVar31;
  local_648._0_4_ = 0xd80;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = sVar31 == 0xd80;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((sVar31 != 0xd80) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8._0_4_ = 0xd80;
    if (uVar7 < 0x20) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined2 *)((long)&(local_5f8->offsetAndKind).value + 2);
    }
    local_598.segment._0_2_ = uVar5;
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", _kjCondition, 3456, subReader.getInt16Field()"
               ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",
               (DebugComparison<int,_short> *)local_648,(int *)local_5d8,(short *)&local_598);
    uVar7 = local_5e8;
  }
  local_648._4_4_ = 0;
  if (0x3f < uVar7) {
    local_648._4_4_ = (local_5f8->field_1).upper32Bits;
  }
  local_648._0_4_ = 0xfb4c100e;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = local_648._4_4_ == 0xfb4c100e;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((local_648._4_4_ != 0xfb4c100e) && (kj::_::Debug::minSeverity < 3)) {
    uVar25 = 0;
    local_5d8._0_4_ = 0xfb4c100e;
    if (0x3f < uVar7) {
      uVar25 = (local_5f8->field_1).upper32Bits;
    }
    local_598.segment._0_4_ = (float)uVar25;
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xef,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", _kjCondition, -78901234, subReader.getInt32Field()"
               ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
               (DebugComparison<int,_int> *)local_648,(int *)local_5d8,(int *)&local_598);
    uVar7 = local_5e8;
  }
  if (uVar7 < 0x80) {
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WStack_640 = local_5f8[1];
  }
  local_648 = (undefined1  [8])0x33a638e8734e;
  local_638 = (undefined1  [8])0x28e598;
  uStack_630 = (WirePointer *)&DAT_00000005;
  local_628 = (char *)CONCAT71(local_628._1_7_,WStack_640 == (WirePointer)0x33a638e8734e);
  pWVar32 = (WirePointer *)0x0;
  if ((WStack_640 != (WirePointer)0x33a638e8734e) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8 = (undefined1  [8])0x33a638e8734e;
    if (uVar7 < 0x80) {
      WVar18.offsetAndKind.value = 0;
      WVar18.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar18 = local_5f8[1];
    }
    local_598.segment = (SegmentReader *)WVar18;
    kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf0,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", _kjCondition, 56789012345678ll, subReader.getInt64Field()"
               ,(char (*) [67])"failed: expected (56789012345678ll) == (subReader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_648,(longlong *)local_5d8,
               (long *)&local_598);
    uVar7 = local_5e8;
    pWVar32 = uStack_630;
  }
  uStack_630 = pWVar32;
  if (uVar7 < 0x88) {
    cVar30 = '\0';
  }
  else {
    cVar30 = (char)local_5f8[2].offsetAndKind.value;
  }
  local_648[4] = cVar30;
  local_648._0_4_ = 0x5a;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = cVar30 == 'Z';
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((cVar30 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    local_5d8._0_4_ = 0x5a;
    if (uVar7 < 0x88) {
      uVar4 = 0;
    }
    else {
      uVar4 = (undefined1)local_5f8[2].offsetAndKind.value;
    }
    local_598.segment._0_1_ = uVar4;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf1,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", _kjCondition, 90u, subReader.getUInt8Field()"
               ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_648,(uint *)local_5d8,
               (uchar *)&local_598);
    uVar7 = local_5e8;
  }
  if (uVar7 < 0xa0) {
    sVar31 = 0;
  }
  else {
    sVar31 = *(short *)((long)&local_5f8[2].offsetAndKind.value + 2);
  }
  local_648._4_2_ = sVar31;
  local_648._0_4_ = 0x4d2;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = sVar31 == 0x4d2;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((sVar31 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8._0_4_ = 0x4d2;
    if (uVar7 < 0xa0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined2 *)((long)&local_5f8[2].offsetAndKind.value + 2);
    }
    local_598.segment._0_2_ = uVar5;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf2,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", _kjCondition, 1234u, subReader.getUInt16Field()"
               ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_648,(uint *)local_5d8,
               (unsigned_short *)&local_598);
    uVar7 = local_5e8;
  }
  local_648._4_4_ = 0;
  if (0xbf < uVar7) {
    local_648._4_4_ = local_5f8[2].field_1.upper32Bits;
  }
  local_648._0_4_ = 0x3628814;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = local_648._4_4_ == 0x3628814;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((local_648._4_4_ != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    uVar25 = 0;
    local_5d8._0_4_ = 0x3628814;
    if (0xbf < uVar7) {
      uVar25 = local_5f8[2].field_1.upper32Bits;
    }
    local_598.segment._0_4_ = (float)uVar25;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", _kjCondition, 56789012u, subReader.getUInt32Field()"
               ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_648,(uint *)local_5d8,
               (uint *)&local_598);
    uVar7 = local_5e8;
  }
  if (uVar7 < 0x100) {
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WStack_640 = local_5f8[3];
  }
  local_648 = (undefined1  [8])0x4cc1921126f0ad2;
  uStack_630 = (WirePointer *)0x5;
  local_638 = (undefined1  [8])" == ";
  local_628 = (char *)CONCAT71(local_628._1_7_,WStack_640 == (WirePointer)0x4cc1921126f0ad2);
  if ((WStack_640 != (WirePointer)0x4cc1921126f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8 = (undefined1  [8])0x4cc1921126f0ad2;
    if (uVar7 < 0x100) {
      WVar19.offsetAndKind.value = 0;
      WVar19.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar19 = local_5f8[3];
    }
    local_598.segment = (SegmentReader *)WVar19;
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", _kjCondition, 345678901234567890ull, subReader.getUInt64Field()"
               ,(char (*) [73])
                "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_648,
               (unsigned_long_long *)local_5d8,(unsigned_long *)&local_598);
    uVar7 = local_5e8;
  }
  fVar34 = 0.0;
  if (uVar7 < 0x120) {
LAB_001d02b7:
    fVar39 = fVar34 + 1.25e-10;
    fVar41 = -fVar39;
    if (-fVar39 <= fVar39) {
      fVar41 = fVar39;
    }
    fVar39 = -fVar34;
    if (-fVar34 <= fVar34) {
      fVar39 = fVar34;
    }
    fVar34 = (fVar39 + 1.25e-10) * 1e-05;
    local_598.segment._0_1_ = fVar41 < fVar34;
    if ((fVar34 <= fVar41) && (kj::_::Debug::minSeverity < 3)) {
      uVar35 = 0;
      if (0x11f < uVar7) {
        uVar35 = local_5f8[4].offsetAndKind.value;
      }
      local_648._0_4_ = uVar35;
      local_5d8._0_4_ = 0xaf09705f;
      kj::_::Debug::log<char_const(&)[84],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", _kjCondition, subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,(DebugExpression<bool> *)&local_598,(float *)local_648,(float *)local_5d8);
      uVar7 = local_5e8;
    }
  }
  else {
    fVar34 = (float)local_5f8[4].offsetAndKind.value;
    if ((fVar34 != -1.25e-10) || (NAN(fVar34))) goto LAB_001d02b7;
  }
  pCVar2 = local_598.capTable;
  WVar36.value = 0;
  aVar38.upper32Bits = 0;
  if (0x17f < uVar7) {
    WVar18 = local_5f8[5];
    WVar36 = WVar18.offsetAndKind.value;
    aVar38 = WVar18.field_1;
    if (((double)WVar18 == 345.0) && (!NAN((double)WVar18))) goto LAB_001d0446;
  }
  dVar42 = (double)CONCAT44(aVar38.upper32Bits,WVar36.value) + -345.0;
  dVar43 = -dVar42;
  if (-dVar42 <= dVar42) {
    dVar43 = dVar42;
  }
  aVar40.upper32Bits = (uint32_t)((ulong)-(double)CONCAT44(aVar38.upper32Bits,WVar36.value) >> 0x20)
  ;
  if (-(double)CONCAT44(aVar38.upper32Bits,WVar36.value) <=
      (double)CONCAT44(aVar38.upper32Bits,WVar36.value)) {
    aVar40 = aVar38;
  }
  dVar42 = ((double)CONCAT44(aVar40.upper32Bits,WVar36.value) + 345.0) * 1e-12;
  local_598.segment._0_1_ = dVar43 < dVar42;
  if ((dVar42 <= dVar43) && (kj::_::Debug::minSeverity < 3)) {
    WVar36.value = 0;
    aVar38.upper32Bits = 0;
    if (0x17f < uVar7) {
      WVar36 = local_5f8[5].offsetAndKind;
      aVar38 = local_5f8[5].field_1;
    }
    local_648 = (undefined1  [8])CONCAT44(aVar38.upper32Bits,WVar36.value);
    local_5d8._0_4_ = 0x159;
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", _kjCondition, subReader.getFloat64Field(), 345"
               ,(char (*) [78])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
               (DebugExpression<bool> *)&local_598,(double *)local_648,(int *)local_5d8);
    pCVar2 = local_598.capTable;
  }
LAB_001d0446:
  local_598.capTable = pCVar2;
  local_598.segment = (SegmentReader *)"baz";
  bVar29 = local_5e4 == 0;
  local_638 = (undefined1  [8])local_5f0;
  if (bVar29) {
    local_638 = (undefined1  [8])(WirePointer *)0x0;
  }
  uStack_630._0_4_ = 0x7fffffff;
  if (!bVar29) {
    uStack_630._0_4_ = local_5e0;
  }
  local_648._0_4_ = 0.0;
  local_648._4_4_ = 0.0;
  WStack_640.offsetAndKind.value = 0;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (!bVar29) {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
  }
  _local_5d8 = (ArrayPtr<const_unsigned_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)local_648,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_648,
             (DebugExpression<char_const(&)[4]> *)&local_598,(Reader *)local_5d8);
  if ((sStack_620._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    bVar29 = local_5e4 == 0;
    local_5c8 = local_5f0;
    if (bVar29) {
      local_5c8 = (WirePointer *)0x0;
    }
    local_5c0 = 0x7fffffff;
    if (!bVar29) {
      local_5c0 = local_5e0;
    }
    local_5d8._0_4_ = 0.0;
    local_5d8._4_4_ = 0.0;
    uStack_5d0._0_4_ = 0;
    uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_5d8._0_4_ = local_608._0_4_;
      local_5d8._4_4_ = local_608._4_4_;
      uStack_5d0._0_4_ = WStack_600.offsetAndKind.value;
      uStack_5d0._4_4_ = WStack_600.field_1;
    }
    _local_5d8 = (ArrayPtr<const_unsigned_char>)
                 PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", _kjCondition, \"baz\", subReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_648,
               (char (*) [4])0x295fef,(Reader *)local_5d8);
  }
  pWVar32 = (WirePointer *)0x0;
  local_638 = (undefined1  [8])(local_5f0 + 1);
  if (local_5e4 < 2) {
    local_638 = (undefined1  [8])pWVar32;
  }
  if (local_5e4 < 2) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  _local_638 = (ArrayPtr<const_unsigned_char>)
               PointerReader::getBlob<capnp::Data>((PointerReader *)local_648,(void *)0x0,0);
  if (local_638._8_8_ == 3) {
    pWVar32 = (WirePointer *)
              (ulong)((char)*(short *)((long)local_638 + 2) == 'x' && *(short *)local_638 == 0x7571)
    ;
  }
  local_648 = (undefined1  [8])0x29c411;
  WStack_640 = (WirePointer)0x3;
  local_628 = " == ";
  sStack_620 = 5;
  local_618 = SUB81(pWVar32,0);
  if ((local_618 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_598.capTable = (CapTableReader *)0x3;
    local_598.segment = (SegmentReader *)"qux";
    local_5c8 = local_5f0 + 1;
    if (local_5e4 < 2) {
      local_5c8 = (WirePointer *)0x0;
    }
    if (local_5e4 < 2) {
      local_5d8._0_4_ = 0.0;
      local_5d8._4_4_ = 0.0;
      uStack_5d0._0_4_ = 0;
      uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      local_5c0 = 0x7fffffff;
    }
    else {
      local_5d8._0_4_ = local_608._0_4_;
      local_5d8._4_4_ = local_608._4_4_;
      uStack_5d0._0_4_ = WStack_600.offsetAndKind.value;
      uStack_5d0._4_4_ = WStack_600.field_1;
      local_5c0 = local_5e0;
    }
    _local_5d8 = (ArrayPtr<const_unsigned_char>)
                 PointerReader::getBlob<capnp::Data>((PointerReader *)local_5d8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", _kjCondition, data(\"qux\"), subReader.getDataField()"
               ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_648,
               (Reader *)&local_598,(Reader *)local_5d8);
  }
  local_5c8 = local_5f0 + 2;
  if (local_5e4 < 3) {
    local_5c8 = (WirePointer *)0x0;
  }
  if (local_5e4 < 3) {
    local_5d8._0_4_ = 0.0;
    local_5d8._4_4_ = 0.0;
    uStack_5d0._0_4_ = 0;
    uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_5c0 = 0x7fffffff;
  }
  else {
    local_5d8._0_4_ = local_608._0_4_;
    local_5d8._4_4_ = local_608._4_4_;
    uStack_5d0._0_4_ = WStack_600.offsetAndKind.value;
    uStack_5d0._4_4_ = WStack_600.field_1;
    local_5c0 = local_5e0;
  }
  PointerReader::getStruct((StructReader *)local_648,(PointerReader *)local_5d8,(word *)0x0);
  local_568.segment = (SegmentReader *)"nested";
  local_5c8 = (WirePointer *)0x0;
  local_5c0 = 0x7fffffff;
  if (local_628._4_2_ != 0) {
    local_5c8 = uStack_630;
    local_5c0 = (int)sStack_620;
  }
  local_5d8._0_4_ = 0.0;
  local_5d8._4_4_ = 0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (local_628._4_2_ != 0) {
    local_5d8._0_4_ = local_648._0_4_;
    local_5d8._4_4_ = local_648._4_4_;
    uStack_5d0._0_4_ = WStack_640.offsetAndKind.value;
    uStack_5d0._4_4_ = WStack_640.field_1;
  }
  local_598._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_5d8,
             (DebugExpression<char_const(&)[7]> *)&local_568,(Reader *)&local_598);
  if ((local_5b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    bVar29 = local_628._4_2_ == 0;
    local_598.data = uStack_630;
    if (bVar29) {
      local_598.data = (WirePointer *)0x0;
    }
    local_598.pointers._0_4_ = 0x7fffffff;
    if (!bVar29) {
      local_598.pointers._0_4_ = (int)sStack_620;
    }
    local_598.segment._0_4_ = 0.0;
    local_598.segment._4_4_ = 0;
    local_598.capTable._0_4_ = 0;
    local_598.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_598.segment._0_4_ = (float)local_648._0_4_;
      local_598.segment._4_4_ = local_648._4_4_;
      local_598.capTable._0_4_ = WStack_640.offsetAndKind.value;
      local_598.capTable._4_4_ = WStack_640.field_1;
    }
    local_598._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfb,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", _kjCondition, \"nested\", subSubReader.getTextField()"
               ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
               (DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_5d8,
               (char (*) [7])0x2a4ec5,(Reader *)&local_598);
  }
  local_5a0 = "really nested";
  local_5c8 = uStack_630 + 2;
  if (local_628._4_2_ < 3) {
    local_5c8 = (WirePointer *)0x0;
  }
  if (local_628._4_2_ < 3) {
    local_5d8._0_4_ = 0.0;
    local_5d8._4_4_ = 0;
    uStack_5d0._0_4_ = 0;
    uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_5c0 = 0x7fffffff;
  }
  else {
    local_5d8._0_4_ = local_648._0_4_;
    local_5d8._4_4_ = local_648._4_4_;
    uStack_5d0._0_4_ = WStack_640.offsetAndKind.value;
    uStack_5d0._4_4_ = WStack_640.field_1;
    local_5c0 = (int)sStack_620;
  }
  PointerReader::getStruct(&local_598,(PointerReader *)local_5d8,(word *)0x0);
  local_5c8 = (WirePointer *)0x0;
  local_5c0 = 0x7fffffff;
  if (local_598.pointerCount != 0) {
    local_5c8 = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    local_5c0 = local_598.nestingLimit;
  }
  local_5d8._0_4_ = 0;
  local_5d8._4_4_ = 0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (local_598.pointerCount != 0) {
    local_5d8._0_4_ = local_598.segment._0_4_;
    local_5d8._4_4_ = local_598.segment._4_4_;
    uStack_5d0._0_4_ = local_598.capTable._0_4_;
    uStack_5d0._4_4_ = local_598.capTable._4_4_;
  }
  local_568._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_5d8,
             (DebugExpression<char_const(&)[14]> *)&local_5a0,(Reader *)&local_568);
  if ((local_5b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    pWVar32 = (WirePointer *)0x0;
    local_568.pointer = uStack_630 + 2;
    if (local_628._4_2_ < 3) {
      local_568.pointer = pWVar32;
    }
    if (local_628._4_2_ < 3) {
      local_568.segment._0_4_ = 0.0;
      local_568.segment._4_4_ = 0;
      local_568.capTable._0_4_ = 0;
      local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      local_568.nestingLimit = 0x7fffffff;
    }
    else {
      local_568.segment._0_4_ = (float)local_648._0_4_;
      local_568.segment._4_4_ = local_648._4_4_;
      local_568.capTable._0_4_ = WStack_640.offsetAndKind.value;
      local_568.capTable._4_4_ = WStack_640.field_1;
      local_568.nestingLimit = (int)sStack_620;
    }
    PointerReader::getStruct(&local_598,&local_568,(word *)0x0);
    local_568.nestingLimit = 0x7fffffff;
    if (local_598.pointerCount != 0) {
      pWVar32 = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
      local_568.nestingLimit = local_598.nestingLimit;
    }
    local_568.segment._0_4_ = (float)0;
    local_568.segment._4_4_ = 0;
    local_568.capTable._0_4_ = 0;
    local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (local_598.pointerCount != 0) {
      local_568.segment._0_4_ = local_598.segment._0_4_;
      local_568.segment._4_4_ = local_598.segment._4_4_;
      local_568.capTable._0_4_ = local_598.capTable._0_4_;
      local_568.capTable._4_4_ = local_598.capTable._4_4_;
    }
    local_568.pointer = pWVar32;
    local_568._0_16_ = PointerReader::getBlob<capnp::Text>(&local_568,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfc,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"really nested\", subSubReader.getStructField().getTextField()"
               ,(char (*) [85])
                "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
               ,(DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_5d8,
               (char (*) [14])"really nested",(Reader *)&local_568);
  }
  pWVar32 = uStack_630;
  if (local_5e8 < 0x130) {
    uVar6 = 0;
  }
  else {
    uVar6 = local_5f8[4].field_1.structRef.dataSize.value;
  }
  local_648._2_2_ = uVar6;
  local_648._0_2_ = 2;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = uVar6 == 2;
  local_638 = (undefined1  [8])&DAT_00000005;
  AVar1 = (ArrayPtr<const_char>)_local_638;
  uStack_630._4_4_ = SUB84(pWVar32,4);
  if ((uVar6 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_5d8._0_2_ = 2;
    if (local_5e8 < 0x130) {
      uVar6 = 0;
    }
    else {
      uVar6 = local_5f8[4].field_1.structRef.dataSize.value;
    }
    local_598.segment._0_2_ = uVar6;
    _local_638 = (ArrayPtr<const_unsigned_char>)AVar1;
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfe,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", _kjCondition, TestEnum::BAZ, subReader.getEnumField()"
               ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
               (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                *)local_648,(TestEnum_9c8e9318b29d9cd3 *)local_5d8,
               (TestEnum_9c8e9318b29d9cd3 *)&local_598);
  }
  local_638 = (undefined1  [8])(local_5f0 + 3);
  if (local_5e4 < 4) {
    local_638 = (undefined1  [8])(WirePointer *)0x0;
  }
  if (local_5e4 < 4) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_60,(PointerReader *)local_648,VOID,(word *)0x0);
  reader_00.reader.capTable = local_60.capTable;
  reader_00.reader.segment = local_60.segment;
  reader_00.reader.ptr = local_60.ptr;
  reader_00.reader.elementCount = local_60.elementCount;
  reader_00.reader.step = local_60.step;
  reader_00.reader.structDataSize = local_60.structDataSize;
  reader_00.reader.structPointerCount = local_60.structPointerCount;
  reader_00.reader.elementSize = local_60.elementSize;
  reader_00.reader._39_1_ = local_60._39_1_;
  reader_00.reader.nestingLimit = local_60.nestingLimit;
  reader_00.reader._44_4_ = local_60._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)local_648;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Reader,_capnp::List<capnp::Void,_(capnp::Kind)0>_>
            (reader_00,expected);
  local_638 = (undefined1  [8])(local_5f0 + 4);
  if (local_5e4 < 5) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_90,(PointerReader *)local_648,BIT,(word *)0x0);
  local_648._0_5_ = 0x101000100;
  reader_01.reader.capTable = local_90.capTable;
  reader_01.reader.segment = local_90.segment;
  reader_01.reader.ptr = local_90.ptr;
  reader_01.reader.elementCount = local_90.elementCount;
  reader_01.reader.step = local_90.step;
  reader_01.reader.structDataSize = local_90.structDataSize;
  reader_01.reader.structPointerCount = local_90.structPointerCount;
  reader_01.reader.elementSize = local_90.elementSize;
  reader_01.reader._39_1_ = local_90._39_1_;
  reader_01.reader.nestingLimit = local_90.nestingLimit;
  reader_01.reader._44_4_ = local_90._44_4_;
  expected_00._M_len = 5;
  expected_00._M_array = (iterator)local_648;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_01,expected_00);
  local_638 = (undefined1  [8])(local_5f0 + 5);
  if (local_5e4 < 6) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_c0,(PointerReader *)local_648,BYTE,(word *)0x0);
  local_648._0_4_ = 0x7f80de0c;
  reader_02.reader.capTable = local_c0.capTable;
  reader_02.reader.segment = local_c0.segment;
  reader_02.reader.ptr = local_c0.ptr;
  reader_02.reader.elementCount = local_c0.elementCount;
  reader_02.reader.step = local_c0.step;
  reader_02.reader.structDataSize = local_c0.structDataSize;
  reader_02.reader.structPointerCount = local_c0.structPointerCount;
  reader_02.reader.elementSize = local_c0.elementSize;
  reader_02.reader._39_1_ = local_c0._39_1_;
  reader_02.reader.nestingLimit = local_c0.nestingLimit;
  reader_02.reader._44_4_ = local_c0._44_4_;
  expected_01._M_len = 4;
  expected_01._M_array = local_648;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_02,expected_01);
  local_638 = (undefined1  [8])(local_5f0 + 6);
  if (local_5e4 < 7) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_f0,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0x7fff8000e9d204d2;
  reader_03.reader.capTable = local_f0.capTable;
  reader_03.reader.segment = local_f0.segment;
  reader_03.reader.ptr = local_f0.ptr;
  reader_03.reader.elementCount = local_f0.elementCount;
  reader_03.reader.step = local_f0.step;
  reader_03.reader.structDataSize = local_f0.structDataSize;
  reader_03.reader.structPointerCount = local_f0.structPointerCount;
  reader_03.reader.elementSize = local_f0.elementSize;
  reader_03.reader._39_1_ = local_f0._39_1_;
  reader_03.reader.nestingLimit = local_f0.nestingLimit;
  reader_03.reader._44_4_ = local_f0._44_4_;
  expected_02._M_len = 4;
  expected_02._M_array = (iterator)local_648;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_03,expected_02);
  local_638 = (undefined1  [8])(local_5f0 + 7);
  if (local_5e4 < 8) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_120,(PointerReader *)local_648,FOUR_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0xfaa0d34000bc614e;
  WStack_640 = (WirePointer)0x7fffffff80000000;
  reader_04.reader.capTable = local_120.capTable;
  reader_04.reader.segment = local_120.segment;
  reader_04.reader.ptr = local_120.ptr;
  reader_04.reader.elementCount = local_120.elementCount;
  reader_04.reader.step = local_120.step;
  reader_04.reader.structDataSize = local_120.structDataSize;
  reader_04.reader.structPointerCount = local_120.structPointerCount;
  reader_04.reader.elementSize = local_120.elementSize;
  reader_04.reader._39_1_ = local_120._39_1_;
  reader_04.reader.nestingLimit = local_120.nestingLimit;
  reader_04.reader._44_4_ = local_120._44_4_;
  expected_03._M_len = 4;
  expected_03._M_array = (iterator)local_648;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_04,expected_03);
  local_638 = (undefined1  [8])(local_5f0 + 8);
  if (local_5e4 < 9) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_150,(PointerReader *)local_648,EIGHT_BYTES,(word *)0x0);
  local_638 = (undefined1  [8])0x8000000000000000;
  uStack_630 = (WirePointer *)0x7fffffffffffffff;
  local_648 = (undefined1  [8])0x7048860ddf79;
  WStack_640 = (WirePointer)0xfffd968afd13752e;
  reader_05.reader.capTable = local_150.capTable;
  reader_05.reader.segment = local_150.segment;
  reader_05.reader.ptr = local_150.ptr;
  reader_05.reader.elementCount = local_150.elementCount;
  reader_05.reader.step = local_150.step;
  reader_05.reader.structDataSize = local_150.structDataSize;
  reader_05.reader.structPointerCount = local_150.structPointerCount;
  reader_05.reader.elementSize = local_150.elementSize;
  reader_05.reader._39_1_ = local_150._39_1_;
  reader_05.reader.nestingLimit = local_150.nestingLimit;
  reader_05.reader._44_4_ = local_150._44_4_;
  expected_04._M_len = 4;
  expected_04._M_array = (iterator)local_648;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_05,expected_04);
  local_638 = (undefined1  [8])(local_5f0 + 9);
  if (local_5e4 < 10) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    iVar33 = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    iVar33 = local_5e0;
  }
  uStack_630._0_4_ = iVar33;
  PointerReader::getList(&local_180,(PointerReader *)local_648,BYTE,(word *)0x0);
  local_648._0_4_ = 0xff00220c;
  reader_06.reader.capTable = local_180.capTable;
  reader_06.reader.segment = local_180.segment;
  reader_06.reader.ptr = local_180.ptr;
  reader_06.reader.elementCount = local_180.elementCount;
  reader_06.reader.step = local_180.step;
  reader_06.reader.structDataSize = local_180.structDataSize;
  reader_06.reader.structPointerCount = local_180.structPointerCount;
  reader_06.reader.elementSize = local_180.elementSize;
  reader_06.reader._39_1_ = local_180._39_1_;
  reader_06.reader.nestingLimit = local_180.nestingLimit;
  reader_06.reader._44_4_ = local_180._44_4_;
  expected_05._M_len = 4;
  expected_05._M_array = local_648;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_06,expected_05);
  local_638 = (undefined1  [8])(local_5f0 + 10);
  if (local_5e4 < 0xb) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_1b0,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0xffff0000162e04d2;
  reader_07.reader.capTable = local_1b0.capTable;
  reader_07.reader.segment = local_1b0.segment;
  reader_07.reader.ptr = local_1b0.ptr;
  reader_07.reader.elementCount = local_1b0.elementCount;
  reader_07.reader.step = local_1b0.step;
  reader_07.reader.structDataSize = local_1b0.structDataSize;
  reader_07.reader.structPointerCount = local_1b0.structPointerCount;
  reader_07.reader.elementSize = local_1b0.elementSize;
  reader_07.reader._39_1_ = local_1b0._39_1_;
  reader_07.reader.nestingLimit = local_1b0.nestingLimit;
  reader_07.reader._44_4_ = local_1b0._44_4_;
  expected_06._M_len = 4;
  expected_06._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_07,expected_06);
  local_638 = (undefined1  [8])(local_5f0 + 0xb);
  if (local_5e4 < 0xc) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_1e0,(PointerReader *)local_648,FOUR_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0x55f2cc000bc614e;
  WStack_640 = (WirePointer)0xffffffff00000000;
  reader_08.reader.capTable = local_1e0.capTable;
  reader_08.reader.segment = local_1e0.segment;
  reader_08.reader.ptr = local_1e0.ptr;
  reader_08.reader.elementCount = local_1e0.elementCount;
  reader_08.reader.step = local_1e0.step;
  reader_08.reader.structDataSize = local_1e0.structDataSize;
  reader_08.reader.structPointerCount = local_1e0.structPointerCount;
  reader_08.reader.elementSize = local_1e0.elementSize;
  reader_08.reader._39_1_ = local_1e0._39_1_;
  reader_08.reader.nestingLimit = local_1e0.nestingLimit;
  reader_08.reader._44_4_ = local_1e0._44_4_;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_08,expected_07);
  local_638 = (undefined1  [8])(local_5f0 + 0xc);
  if (local_5e4 < 0xd) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_210,(PointerReader *)local_648,EIGHT_BYTES,(word *)0x0);
  local_638 = (undefined1  [8])0x0;
  uStack_630 = (WirePointer *)0xffffffffffffffff;
  local_648 = (undefined1  [8])0x7048860ddf79;
  WStack_640 = (WirePointer)0x2697502ec8ad2;
  reader_09.reader.capTable = local_210.capTable;
  reader_09.reader.segment = local_210.segment;
  reader_09.reader.ptr = local_210.ptr;
  reader_09.reader.elementCount = local_210.elementCount;
  reader_09.reader.step = local_210.step;
  reader_09.reader.structDataSize = local_210.structDataSize;
  reader_09.reader.structPointerCount = local_210.structPointerCount;
  reader_09.reader.elementSize = local_210.elementSize;
  reader_09.reader._39_1_ = local_210._39_1_;
  reader_09.reader.nestingLimit = local_210.nestingLimit;
  reader_09.reader._44_4_ = local_210._44_4_;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_09,expected_08);
  local_638 = (undefined1  [8])(local_5f0 + 0xd);
  if (local_5e4 < 0xe) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    iVar33 = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    iVar33 = local_5e0;
  }
  uStack_630._0_4_ = iVar33;
  PointerReader::getList(&local_240,(PointerReader *)local_648,FOUR_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0x4996b43800000000;
  WStack_640 = (WirePointer)0xfcf0bdc27cf0bdc2;
  local_638 = (undefined1  [8])0x82081cea02081cea;
  reader_10.reader.capTable = local_240.capTable;
  reader_10.reader.segment = local_240.segment;
  reader_10.reader.ptr = local_240.ptr;
  reader_10.reader.elementCount = local_240.elementCount;
  reader_10.reader.step = local_240.step;
  reader_10.reader.structDataSize = local_240.structDataSize;
  reader_10.reader.structPointerCount = local_240.structPointerCount;
  reader_10.reader.elementSize = local_240.elementSize;
  reader_10.reader._39_1_ = local_240._39_1_;
  reader_10.reader.nestingLimit = local_240.nestingLimit;
  reader_10.reader._44_4_ = local_240._44_4_;
  expected_09._M_len = 6;
  expected_09._M_array = (iterator)local_648;
  checkList<capnp::List<float,_(capnp::Kind)0>::Reader,_capnp::List<float,_(capnp::Kind)0>_>
            (reader_10,expected_09);
  local_638 = (undefined1  [8])(local_5f0 + 0xe);
  if (local_5e4 < 0xf) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    iVar33 = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    iVar33 = local_5e0;
  }
  uStack_630._0_4_ = iVar33;
  PointerReader::getList(&local_270,(PointerReader *)local_648,EIGHT_BYTES,(word *)0x0);
  local_628 = (char *)0x66789e3750f791;
  sStack_620 = 0x8066789e3750f791;
  local_638 = (undefined1  [8])0x7f76c8e5ca239029;
  uStack_630 = (WirePointer *)0xff76c8e5ca239029;
  local_648 = (undefined1  [8])0x0;
  WStack_640 = (WirePointer)0x42dc12218377de40;
  reader_11.reader.capTable = local_270.capTable;
  reader_11.reader.segment = local_270.segment;
  reader_11.reader.ptr = local_270.ptr;
  reader_11.reader.elementCount = local_270.elementCount;
  reader_11.reader.step = local_270.step;
  reader_11.reader.structDataSize = local_270.structDataSize;
  reader_11.reader.structPointerCount = local_270.structPointerCount;
  reader_11.reader.elementSize = local_270.elementSize;
  reader_11.reader._39_1_ = local_270._39_1_;
  reader_11.reader.nestingLimit = local_270.nestingLimit;
  reader_11.reader._44_4_ = local_270._44_4_;
  expected_10._M_len = 6;
  expected_10._M_array = (iterator)local_648;
  checkList<capnp::List<double,_(capnp::Kind)0>::Reader,_capnp::List<double,_(capnp::Kind)0>_>
            (reader_11,expected_10);
  local_638 = (undefined1  [8])(local_5f0 + 0xf);
  if (local_5e4 < 0x10) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    iVar33 = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    iVar33 = local_5e0;
  }
  uStack_630._0_4_ = iVar33;
  PointerReader::getList(&local_2a0,(PointerReader *)local_648,POINTER,(word *)0x0);
  local_648 = (undefined1  [8])0x29c418;
  WStack_640 = (WirePointer)&DAT_00000005;
  local_638 = (undefined1  [8])0x29e81a;
  uStack_630 = (WirePointer *)0x6;
  local_628 = "grault";
  sStack_620 = 7;
  reader_12.reader.capTable = local_2a0.capTable;
  reader_12.reader.segment = local_2a0.segment;
  reader_12.reader.ptr = local_2a0.ptr;
  reader_12.reader.elementCount = local_2a0.elementCount;
  reader_12.reader.step = local_2a0.step;
  reader_12.reader.structDataSize = local_2a0.structDataSize;
  reader_12.reader.structPointerCount = local_2a0.structPointerCount;
  reader_12.reader.elementSize = local_2a0.elementSize;
  reader_12.reader._39_1_ = local_2a0._39_1_;
  reader_12.reader.nestingLimit = local_2a0.nestingLimit;
  reader_12.reader._44_4_ = local_2a0._44_4_;
  expected_11._M_len = 3;
  expected_11._M_array = (iterator)local_648;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_12,expected_11);
  local_638 = (undefined1  [8])(local_5f0 + 0x10);
  if (local_5e4 < 0x11) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    iVar33 = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    iVar33 = local_5e0;
  }
  uStack_630._0_4_ = iVar33;
  PointerReader::getList(&local_2d0,(PointerReader *)local_648,POINTER,(word *)0x0);
  local_648 = (undefined1  [8])0x2a0a33;
  WStack_640 = (WirePointer)0x6;
  uStack_630 = (WirePointer *)0x5;
  local_638 = (undefined1  [8])anon_var_dwarf_b3bb6;
  local_628 = "fred";
  sStack_620 = 4;
  reader_13.reader.capTable = local_2d0.capTable;
  reader_13.reader.segment = local_2d0.segment;
  reader_13.reader.ptr = local_2d0.ptr;
  reader_13.reader.elementCount = local_2d0.elementCount;
  reader_13.reader.step = local_2d0.step;
  reader_13.reader.structDataSize = local_2d0.structDataSize;
  reader_13.reader.structPointerCount = local_2d0.structPointerCount;
  reader_13.reader.elementSize = local_2d0.elementSize;
  reader_13.reader._39_1_ = local_2d0._39_1_;
  reader_13.reader.nestingLimit = local_2d0.nestingLimit;
  reader_13.reader._44_4_ = local_2d0._44_4_;
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)local_648;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
            (reader_13,expected_12);
  local_5c8 = (WirePointer *)0x0;
  local_5c0 = 0x7fffffff;
  if (0x11 < local_5e4) {
    local_5c8 = local_5f0 + 0x11;
    local_5c0 = local_5e0;
  }
  local_5d8._0_4_ = 0.0;
  local_5d8._4_4_ = 0.0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (0x11 < local_5e4) {
    local_5d8._0_4_ = local_608._0_4_;
    local_5d8._4_4_ = local_608._4_4_;
    uStack_5d0._0_4_ = WStack_600.offsetAndKind.value;
    uStack_5d0._4_4_ = WStack_600.field_1;
  }
  PointerReader::getList
            ((ListReader *)local_648,(PointerReader *)local_5d8,INLINE_COMPOSITE,(word *)0x0);
  local_5d8._4_4_ = (ListElementCount)uStack_630;
  local_5d8._0_4_ = 3;
  uStack_5d0 = (CapTableReader *)" == ";
  local_5c8 = (WirePointer *)&DAT_00000005;
  local_5c0 = CONCAT31(local_5c0._1_3_,(ListElementCount)uStack_630 == 3);
  if ((ListElementCount)uStack_630 != 3) {
    local_568.segment._0_4_ = 4.2039e-45;
    local_5a0 = (char *)CONCAT44(local_5a0._4_4_,(ListElementCount)uStack_630);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x111,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_5d8,(uint *)&local_568,
               (uint *)&local_5a0);
    kj::_::Debug::Fault::fatal((Fault *)&local_598);
  }
  local_5a0 = "x structlist 1";
  ListReader::getStructElement(&local_598,(ListReader *)local_648,0);
  bVar29 = local_598.pointerCount == 0;
  local_5c8 = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
  if (bVar29) {
    local_5c8 = (WirePointer *)0x0;
  }
  local_5c0 = 0x7fffffff;
  if (!bVar29) {
    local_5c0 = local_598.nestingLimit;
  }
  local_5d8._0_4_ = 0;
  local_5d8._4_4_ = 0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (!bVar29) {
    local_5d8._0_4_ = local_598.segment._0_4_;
    local_5d8._4_4_ = local_598.segment._4_4_;
    uStack_5d0._0_4_ = local_598.capTable._0_4_;
    uStack_5d0._4_4_ = local_598.capTable._4_4_;
  }
  local_568._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
             (DebugExpression<char_const(&)[15]> *)&local_5a0,(Reader *)&local_568);
  if ((local_5b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement(&local_598,(ListReader *)local_648,0);
    bVar29 = local_598.pointerCount == 0;
    local_568.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    if (bVar29) {
      local_568.pointer = (WirePointer *)0x0;
    }
    local_568.nestingLimit = 0x7fffffff;
    if (!bVar29) {
      local_568.nestingLimit = local_598.nestingLimit;
    }
    local_568.segment._0_4_ = (float)0;
    local_568.segment._4_4_ = 0;
    local_568.capTable._0_4_ = 0;
    local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_568.segment._0_4_ = local_598.segment._0_4_;
      local_568.segment._4_4_ = local_598.segment._4_4_;
      local_568.capTable._0_4_ = local_598.capTable._0_4_;
      local_568.capTable._4_4_ = local_598.capTable._4_4_;
    }
    local_568._0_16_ = PointerReader::getBlob<capnp::Text>(&local_568,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x112,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"x structlist 1\", listReader[0].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
               (char (*) [15])"x structlist 1",(Reader *)&local_568);
  }
  local_5a0 = "x structlist 2";
  ListReader::getStructElement(&local_598,(ListReader *)local_648,1);
  bVar29 = local_598.pointerCount == 0;
  local_5c8 = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
  if (bVar29) {
    local_5c8 = (WirePointer *)0x0;
  }
  local_5c0 = 0x7fffffff;
  if (!bVar29) {
    local_5c0 = local_598.nestingLimit;
  }
  local_5d8._0_4_ = 0;
  local_5d8._4_4_ = 0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (!bVar29) {
    local_5d8._0_4_ = local_598.segment._0_4_;
    local_5d8._4_4_ = local_598.segment._4_4_;
    uStack_5d0._0_4_ = local_598.capTable._0_4_;
    uStack_5d0._4_4_ = local_598.capTable._4_4_;
  }
  local_568._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
             (DebugExpression<char_const(&)[15]> *)&local_5a0,(Reader *)&local_568);
  if ((local_5b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement(&local_598,(ListReader *)local_648,1);
    bVar29 = local_598.pointerCount == 0;
    local_568.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    if (bVar29) {
      local_568.pointer = (WirePointer *)0x0;
    }
    local_568.nestingLimit = 0x7fffffff;
    if (!bVar29) {
      local_568.nestingLimit = local_598.nestingLimit;
    }
    local_568.segment._0_4_ = (float)0;
    local_568.segment._4_4_ = 0;
    local_568.capTable._0_4_ = 0;
    local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_568.segment._0_4_ = local_598.segment._0_4_;
      local_568.segment._4_4_ = local_598.segment._4_4_;
      local_568.capTable._0_4_ = local_598.capTable._0_4_;
      local_568.capTable._4_4_ = local_598.capTable._4_4_;
    }
    local_568._0_16_ = PointerReader::getBlob<capnp::Text>(&local_568,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"x structlist 2\", listReader[1].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
               (char (*) [15])"x structlist 2",(Reader *)&local_568);
  }
  local_5a0 = "x structlist 3";
  ListReader::getStructElement(&local_598,(ListReader *)local_648,2);
  bVar29 = local_598.pointerCount == 0;
  local_5c8 = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
  if (bVar29) {
    local_5c8 = (WirePointer *)0x0;
  }
  local_5c0 = 0x7fffffff;
  if (!bVar29) {
    local_5c0 = local_598.nestingLimit;
  }
  local_5d8._0_4_ = 0;
  local_5d8._4_4_ = 0;
  uStack_5d0._0_4_ = 0;
  uStack_5d0._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (!bVar29) {
    local_5d8._0_4_ = local_598.segment._0_4_;
    local_5d8._4_4_ = local_598.segment._4_4_;
    uStack_5d0._0_4_ = local_598.capTable._0_4_;
    uStack_5d0._4_4_ = local_598.capTable._4_4_;
  }
  local_568._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
             (DebugExpression<char_const(&)[15]> *)&local_5a0,(Reader *)&local_568);
  if ((local_5b0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement(&local_598,(ListReader *)local_648,2);
    bVar29 = local_598.pointerCount == 0;
    local_568.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    if (bVar29) {
      local_568.pointer = (WirePointer *)0x0;
    }
    local_568.nestingLimit = 0x7fffffff;
    if (!bVar29) {
      local_568.nestingLimit = local_598.nestingLimit;
    }
    local_568.segment._0_4_ = (float)0;
    local_568.segment._4_4_ = 0;
    local_568.capTable._0_4_ = 0;
    local_568.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    if (!bVar29) {
      local_568.segment._0_4_ = local_598.segment._0_4_;
      local_568.segment._4_4_ = local_598.segment._4_4_;
      local_568.capTable._0_4_ = local_598.capTable._0_4_;
      local_568.capTable._4_4_ = local_598.capTable._4_4_;
    }
    local_568._0_16_ = PointerReader::getBlob<capnp::Text>(&local_568,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x114,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"x structlist 3\", listReader[2].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5d8,
               (char (*) [15])"x structlist 3",(Reader *)&local_568);
  }
  pWVar32 = (WirePointer *)0x0;
  local_638 = (undefined1  [8])(local_5f0 + 0x12);
  if (local_5e4 < 0x13) {
    local_638 = (undefined1  [8])pWVar32;
  }
  if (local_5e4 < 0x13) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0.0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    uStack_630._0_4_ = 0x7fffffff;
  }
  else {
    local_648._0_4_ = local_608._0_4_;
    local_648._4_4_ = local_608._4_4_;
    WStack_640.offsetAndKind.value = WStack_600.offsetAndKind.value;
    WStack_640.field_1 = WStack_600.field_1;
    uStack_630._0_4_ = local_5e0;
  }
  PointerReader::getList(&local_300,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
  local_648._0_6_ = 0x600010003;
  reader_14.reader.capTable = local_300.capTable;
  reader_14.reader.segment = local_300.segment;
  reader_14.reader.ptr = local_300.ptr;
  reader_14.reader.elementCount = local_300.elementCount;
  reader_14.reader.step = local_300.step;
  reader_14.reader.structDataSize = local_300.structDataSize;
  reader_14.reader.structPointerCount = local_300.structPointerCount;
  reader_14.reader.elementSize = local_300.elementSize;
  reader_14.reader._39_1_ = local_300._39_1_;
  reader_14.reader.nestingLimit = local_300.nestingLimit;
  reader_14.reader._44_4_ = local_300._44_4_;
  expected_13._M_len = 3;
  expected_13._M_array = (iterator)local_648;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
            (reader_14,expected_13);
  if (0x12f < in_stack_00000028) {
    pWVar32 = (WirePointer *)(ulong)*(ushort *)(in_stack_00000018 + 0x24);
  }
  sVar31 = (short)pWVar32;
  local_648._2_2_ = sVar31;
  local_648._0_2_ = 5;
  WStack_640 = (WirePointer)0x28e598;
  uStack_630._0_1_ = sVar31 == 5;
  local_638 = (undefined1  [8])&DAT_00000005;
  if ((sVar31 != 5) && (kj::_::Debug::minSeverity < 3)) {
    local_608._0_2_ = 5;
    if (in_stack_00000028 < 0x130) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined2 *)(in_stack_00000018 + 0x24);
    }
    local_5d8._0_2_ = uVar5;
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x118,ERROR,
               "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", _kjCondition, TestEnum::CORGE, reader.getEnumField()"
               ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
               (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                *)local_648,(TestEnum_9c8e9318b29d9cd3 *)local_608,
               (TestEnum_9c8e9318b29d9cd3 *)local_5d8);
  }
  local_5f8 = in_stack_00000020 + 3;
  if (in_stack_0000002c < 4) {
    local_5f8 = (WirePointer *)0x0;
  }
  local_608._0_4_ = in_stack_00000008;
  local_608._4_4_ = in_stack_0000000c;
  WStack_600.offsetAndKind.value = in_stack_00000010;
  WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  iVar33 = _kjCondition._0_4_;
  if (in_stack_0000002c < 4) {
    local_608._0_4_ = 0.0;
    local_608._4_4_ = 0;
    WStack_600.offsetAndKind.value = 0;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    iVar33 = 0x7fffffff;
  }
  local_5f0._0_4_ = iVar33;
  PointerReader::getList((ListReader *)local_648,(PointerReader *)local_608,VOID,(word *)0x0);
  local_5d8._4_4_ = (ListElementCount)uStack_630;
  local_5d8._0_4_ = 6;
  uStack_5d0 = (CapTableReader *)" == ";
  local_5c8 = (WirePointer *)&DAT_00000005;
  local_5c0 = CONCAT31(local_5c0._1_3_,(ListElementCount)uStack_630 == 6);
  if (((ListElementCount)uStack_630 != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_598.segment._0_4_ = 8.40779e-45;
    local_5f8 = in_stack_00000020 + 3;
    if (in_stack_0000002c < 4) {
      local_5f8 = (WirePointer *)0x0;
    }
    local_608._0_4_ = in_stack_00000008;
    local_608._4_4_ = in_stack_0000000c;
    WStack_600.offsetAndKind.value = in_stack_00000010;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
    local_5f0._0_4_ = _kjCondition._0_4_;
    if (in_stack_0000002c < 4) {
      local_608._0_4_ = 0.0;
      local_608._4_4_ = 0;
      WStack_600.offsetAndKind.value = 0;
      WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      local_5f0._0_4_ = 0x7fffffff;
    }
    PointerReader::getList((ListReader *)local_648,(PointerReader *)local_608,VOID,(word *)0x0);
    local_608._0_4_ = (ListElementCount)uStack_630;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x11a,ERROR,
               "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", _kjCondition, 6u, reader.getVoidList().size()"
               ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_5d8,(uint *)&local_598,
               (uint *)local_608);
  }
  local_638 = (undefined1  [8])(in_stack_00000020 + 4);
  if (in_stack_0000002c < 5) {
    local_638 = (undefined1  [8])(WirePointer *)0x0;
  }
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar26 = _kjCondition._0_4_;
  if (in_stack_0000002c < 5) {
    uVar26._0_1_ = true;
    uVar26._1_1_ = true;
    uVar26._2_2_ = 0x7fff;
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  }
  uStack_630._0_1_ = SUB41(uVar26,0);
  uStack_630._1_1_ = SUB41(uVar26,1);
  uStack_630._2_2_ = SUB42(uVar26,2);
  PointerReader::getList(&local_330,(PointerReader *)local_648,BIT,(word *)0x0);
  local_648._0_4_ = 0x1000001;
  reader_15.reader.capTable = local_330.capTable;
  reader_15.reader.segment = local_330.segment;
  reader_15.reader.ptr = local_330.ptr;
  reader_15.reader.elementCount = local_330.elementCount;
  reader_15.reader.step = local_330.step;
  reader_15.reader.structDataSize = local_330.structDataSize;
  reader_15.reader.structPointerCount = local_330.structPointerCount;
  reader_15.reader.elementSize = local_330.elementSize;
  reader_15.reader._39_1_ = local_330._39_1_;
  reader_15.reader.nestingLimit = local_330.nestingLimit;
  reader_15.reader._44_4_ = local_330._44_4_;
  expected_14._M_len = 4;
  expected_14._M_array = (iterator)local_648;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_15,expected_14);
  local_638 = (undefined1  [8])(in_stack_00000020 + 5);
  uVar8._0_1_ = true;
  uVar8._1_1_ = true;
  uVar8._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 6) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar8;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_360,(PointerReader *)local_648,BYTE,(word *)0x0);
  local_648._0_2_ = 0x916f;
  reader_16.reader.capTable = local_360.capTable;
  reader_16.reader.segment = local_360.segment;
  reader_16.reader.ptr = local_360.ptr;
  reader_16.reader.elementCount = local_360.elementCount;
  reader_16.reader.step = local_360.step;
  reader_16.reader.structDataSize = local_360.structDataSize;
  reader_16.reader.structPointerCount = local_360.structPointerCount;
  reader_16.reader.elementSize = local_360.elementSize;
  reader_16.reader._39_1_ = local_360._39_1_;
  reader_16.reader.nestingLimit = local_360.nestingLimit;
  reader_16.reader._44_4_ = local_360._44_4_;
  expected_15._M_len = 2;
  expected_15._M_array = local_648;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_16,expected_15);
  local_638 = (undefined1  [8])(in_stack_00000020 + 6);
  uVar9._0_1_ = true;
  uVar9._1_1_ = true;
  uVar9._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 7) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar9;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_390,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
  local_648._0_4_ = 0xd4992b67;
  reader_17.reader.capTable = local_390.capTable;
  reader_17.reader.segment = local_390.segment;
  reader_17.reader.ptr = local_390.ptr;
  reader_17.reader.elementCount = local_390.elementCount;
  reader_17.reader.step = local_390.step;
  reader_17.reader.structDataSize = local_390.structDataSize;
  reader_17.reader.structPointerCount = local_390.structPointerCount;
  reader_17.reader.elementSize = local_390.elementSize;
  reader_17.reader._39_1_ = local_390._39_1_;
  reader_17.reader.nestingLimit = local_390.nestingLimit;
  reader_17.reader._44_4_ = local_390._44_4_;
  expected_16._M_len = 2;
  expected_16._M_array = (iterator)local_648;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_17,expected_16);
  local_638 = (undefined1  [8])(in_stack_00000020 + 7);
  uVar10._0_1_ = true;
  uVar10._1_1_ = true;
  uVar10._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 8) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar10;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_3c0,(PointerReader *)local_648,FOUR_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0xf9609439069f6bc7;
  reader_18.reader.capTable = local_3c0.capTable;
  reader_18.reader.segment = local_3c0.segment;
  reader_18.reader.ptr = local_3c0.ptr;
  reader_18.reader.elementCount = local_3c0.elementCount;
  reader_18.reader.step = local_3c0.step;
  reader_18.reader.structDataSize = local_3c0.structDataSize;
  reader_18.reader.structPointerCount = local_3c0.structPointerCount;
  reader_18.reader.elementSize = local_3c0.elementSize;
  reader_18.reader._39_1_ = local_3c0._39_1_;
  reader_18.reader.nestingLimit = local_3c0.nestingLimit;
  reader_18.reader._44_4_ = local_3c0._44_4_;
  expected_17._M_len = 2;
  expected_17._M_array = (iterator)local_648;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_18,expected_17);
  local_638 = (undefined1  [8])(in_stack_00000020 + 8);
  uVar11._0_1_ = true;
  uVar11._1_1_ = true;
  uVar11._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 9) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar11;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_3f0,(PointerReader *)local_648,EIGHT_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0xf6b75ab2bc471c7;
  WStack_640 = (WirePointer)0xf0948a54d43b8e39;
  reader_19.reader.capTable = local_3f0.capTable;
  reader_19.reader.segment = local_3f0.segment;
  reader_19.reader.ptr = local_3f0.ptr;
  reader_19.reader.elementCount = local_3f0.elementCount;
  reader_19.reader.step = local_3f0.step;
  reader_19.reader.structDataSize = local_3f0.structDataSize;
  reader_19.reader.structPointerCount = local_3f0.structPointerCount;
  reader_19.reader.elementSize = local_3f0.elementSize;
  reader_19.reader._39_1_ = local_3f0._39_1_;
  reader_19.reader.nestingLimit = local_3f0.nestingLimit;
  reader_19.reader._44_4_ = local_3f0._44_4_;
  expected_18._M_len = 2;
  expected_18._M_array = (iterator)local_648;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_19,expected_18);
  local_638 = (undefined1  [8])(in_stack_00000020 + 9);
  uVar12._0_1_ = true;
  uVar12._1_1_ = true;
  uVar12._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 10) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar12;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_420,(PointerReader *)local_648,BYTE,(word *)0x0);
  local_648._0_2_ = 0xde6f;
  reader_20.reader.capTable = local_420.capTable;
  reader_20.reader.segment = local_420.segment;
  reader_20.reader.ptr = local_420.ptr;
  reader_20.reader.elementCount = local_420.elementCount;
  reader_20.reader.step = local_420.step;
  reader_20.reader.structDataSize = local_420.structDataSize;
  reader_20.reader.structPointerCount = local_420.structPointerCount;
  reader_20.reader.elementSize = local_420.elementSize;
  reader_20.reader._39_1_ = local_420._39_1_;
  reader_20.reader.nestingLimit = local_420.nestingLimit;
  reader_20.reader._44_4_ = local_420._44_4_;
  expected_19._M_len = 2;
  expected_19._M_array = local_648;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_20,expected_19);
  local_638 = (undefined1  [8])(in_stack_00000020 + 10);
  uVar13._0_1_ = true;
  uVar13._1_1_ = true;
  uVar13._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 0xb) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar13;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_450,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
  local_648._0_4_ = 0xad9c8235;
  reader_21.reader.capTable = local_450.capTable;
  reader_21.reader.segment = local_450.segment;
  reader_21.reader.ptr = local_450.ptr;
  reader_21.reader.elementCount = local_450.elementCount;
  reader_21.reader.step = local_450.step;
  reader_21.reader.structDataSize = local_450.structDataSize;
  reader_21.reader.structPointerCount = local_450.structPointerCount;
  reader_21.reader.elementSize = local_450.elementSize;
  reader_21.reader._39_1_ = local_450._39_1_;
  reader_21.reader.nestingLimit = local_450.nestingLimit;
  reader_21.reader._44_4_ = local_450._44_4_;
  expected_20._M_len = 2;
  expected_20._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_21,expected_20);
  local_638 = (undefined1  [8])(in_stack_00000020 + 0xb);
  uVar14._0_1_ = true;
  uVar14._1_1_ = true;
  uVar14._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 0xc) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar14;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_480,(PointerReader *)local_648,FOUR_BYTES,(word *)0x0);
  local_648._0_4_ = 0xc6aea155;
  reader_22.reader.capTable = local_480.capTable;
  reader_22.reader.segment = local_480.segment;
  reader_22.reader.ptr = local_480.ptr;
  reader_22.reader.elementCount = local_480.elementCount;
  reader_22.reader.step = local_480.step;
  reader_22.reader.structDataSize = local_480.structDataSize;
  reader_22.reader.structPointerCount = local_480.structPointerCount;
  reader_22.reader.elementSize = local_480.elementSize;
  reader_22.reader._39_1_ = local_480._39_1_;
  reader_22.reader.nestingLimit = local_480.nestingLimit;
  reader_22.reader._44_4_ = local_480._44_4_;
  expected_21._M_len = 1;
  expected_21._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_22,expected_21);
  local_638 = (undefined1  [8])(in_stack_00000020 + 0xc);
  uVar15._0_1_ = true;
  uVar15._1_1_ = true;
  uVar15._2_2_ = 0x7fff;
  local_648._0_4_ = in_stack_00000008;
  local_648._4_4_ = in_stack_0000000c;
  WStack_640.offsetAndKind.value = in_stack_00000010;
  WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  uVar21 = _kjCondition._0_4_;
  if (in_stack_0000002c < 0xd) {
    local_648._0_4_ = 0.0;
    local_648._4_4_ = 0;
    WStack_640.offsetAndKind.value = 0;
    WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
    local_638 = (undefined1  [8])(WirePointer *)0x0;
    uVar21 = uVar15;
  }
  uStack_630._0_1_ = SUB41(uVar21,0);
  uStack_630._1_1_ = SUB41(uVar21,1);
  uStack_630._2_2_ = SUB42(uVar21,2);
  PointerReader::getList(&local_4b0,(PointerReader *)local_648,EIGHT_BYTES,(word *)0x0);
  local_648 = (undefined1  [8])0x9a3298afb5ac71c7;
  reader_23.reader.capTable = local_4b0.capTable;
  reader_23.reader.segment = local_4b0.segment;
  reader_23.reader.ptr = local_4b0.ptr;
  reader_23.reader.elementCount = local_4b0.elementCount;
  reader_23.reader.step = local_4b0.step;
  reader_23.reader.structDataSize = local_4b0.structDataSize;
  reader_23.reader.structPointerCount = local_4b0.structPointerCount;
  reader_23.reader.elementSize = local_4b0.elementSize;
  reader_23.reader._39_1_ = local_4b0._39_1_;
  reader_23.reader.nestingLimit = local_4b0.nestingLimit;
  reader_23.reader._44_4_ = local_4b0._44_4_;
  expected_22._M_len = 1;
  expected_22._M_array = (iterator)local_648;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_23,expected_22);
  local_5f8 = (WirePointer *)0x0;
  iVar33 = 0x7fffffff;
  if (0xd < in_stack_0000002c) {
    local_5f8 = in_stack_00000020 + 0xd;
    iVar33 = _kjCondition._0_4_;
  }
  local_608._0_4_ = 0.0;
  local_608._4_4_ = 0;
  WStack_600.offsetAndKind.value = 0;
  WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
  if (0xd < in_stack_0000002c) {
    local_608._0_4_ = in_stack_00000008;
    local_608._4_4_ = in_stack_0000000c;
    WStack_600.offsetAndKind.value = in_stack_00000010;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
  }
  local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
  PointerReader::getList((ListReader *)local_648,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  local_608._4_4_ = (ListElementCount)uStack_630;
  local_608._0_4_ = 4;
  WStack_600 = (WirePointer)" == ";
  local_5f8 = (WirePointer *)&DAT_00000005;
  local_5f0 = (WirePointer *)CONCAT71(local_5f0._1_7_,(ListElementCount)uStack_630 == 4);
  if ((ListElementCount)uStack_630 == 4) {
    local_608._4_4_ = ((WireValue<uint32_t> *)local_638)->value;
    local_5f0._0_1_ = (float)local_608._4_4_ == 5555.5;
    local_608._0_4_ = 0x45ad9c00;
    WStack_600 = (WirePointer)" == ";
    local_5f8 = (WirePointer *)&DAT_00000005;
    if (kj::_::Debug::minSeverity < 3 && !local_5f0._0_1_) {
      local_5d8._0_4_ = 0x45ad9c00;
      local_598.segment._0_4_ = (float)((WireValue<uint32_t> *)local_638)->value;
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x127,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0])\", _kjCondition, 5555.5f, listReader[0]"
                 ,(char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
                 (DebugComparison<float,_float> *)local_608,(float *)local_5d8,(float *)&local_598);
    }
    local_608._4_4_ =
         *(float *)((long)&(((WirePointer *)local_638)->offsetAndKind).value +
                   (ulong)(uStack_630._4_4_ >> 3));
    local_5f0._0_1_ = INFINITY <= (float)local_608._4_4_;
    local_608._0_4_ = 0x7f800000;
    WStack_600 = (WirePointer)" == ";
    local_5f8 = (WirePointer *)&DAT_00000005;
    auVar20 = local_638;
    if (kj::_::Debug::minSeverity < 3 && !local_5f0._0_1_) {
      local_5d8._0_4_ = 0x7f800000;
      local_598.segment._0_4_ =
           (float)*(undefined4 *)
                   ((long)&(((WirePointer *)local_638)->offsetAndKind).value +
                   (ulong)(uStack_630._4_4_ >> 3));
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x128,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 (DebugComparison<float,_float> *)local_608,(float *)local_5d8,(float *)&local_598);
      auVar20 = local_638;
    }
    local_608._4_4_ =
         *(float *)((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                   (ulong)(uStack_630._4_4_ >> 2));
    local_608._0_4_ = 0xff800000;
    WStack_600 = (WirePointer)" == ";
    local_5f8 = (WirePointer *)&DAT_00000005;
    local_5f0 = (WirePointer *)CONCAT71(local_5f0._1_7_,(float)local_608._4_4_ <= -INFINITY);
    uVar7 = uStack_630._4_4_;
    if (kj::_::Debug::minSeverity < 3 && (float)local_608._4_4_ > -INFINITY) {
      local_5d8._0_4_ = 0xff800000;
      local_598.segment._0_4_ =
           (float)*(undefined4 *)
                   ((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                   (ulong)(uStack_630._4_4_ >> 2));
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x129,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 (DebugComparison<float,_float> *)local_608,(float *)local_5d8,(float *)&local_598);
      auVar20 = local_638;
      uVar7 = uStack_630._4_4_;
    }
    bVar29 = NAN(*(float *)((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                           ((ulong)uVar7 * 3 >> 3)));
    local_608[0] = bVar29;
    if ((!bVar29) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12a,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                 (char (*) [38])"failed: expected isNaN(listReader[3])",
                 (DebugExpression<bool> *)local_608);
    }
    local_5f8 = in_stack_00000020 + 0xe;
    if (in_stack_0000002c < 0xf) {
      local_5f8 = (WirePointer *)0x0;
    }
    local_608._0_4_ = in_stack_00000008;
    local_608._4_4_ = in_stack_0000000c;
    WStack_600.offsetAndKind.value = in_stack_00000010;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
    iVar33 = _kjCondition._0_4_;
    if (in_stack_0000002c < 0xf) {
      local_608._0_4_ = 0.0;
      local_608._4_4_ = 0;
      WStack_600.offsetAndKind.value = 0;
      WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      iVar33 = 0x7fffffff;
    }
    local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
    PointerReader::getList
              ((ListReader *)local_648,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
    local_608._4_4_ = (ListElementCount)uStack_630;
    local_608._0_4_ = 4;
    WStack_600 = (WirePointer)" == ";
    local_5f8 = (WirePointer *)&DAT_00000005;
    local_5f0 = (WirePointer *)CONCAT71(local_5f0._1_7_,(ListElementCount)uStack_630 == 4);
    if ((ListElementCount)uStack_630 == 4) {
      WVar18 = *(WirePointer *)local_638;
      WStack_600.offsetAndKind.value = WVar18.offsetAndKind.value;
      WStack_600.field_1 = WVar18.field_1;
      local_608 = (undefined1  [8])0x40be61c000000000;
      local_5f8 = (WirePointer *)0x28e598;
      local_5f0 = (WirePointer *)&DAT_00000005;
      if (kj::_::Debug::minSeverity < 3 && (double)WVar18 != 7777.75) {
        local_5d8 = (undefined1  [8])0x40be61c000000000;
        local_598.segment = (SegmentReader *)*(WirePointer *)local_638;
        local_5e8._0_1_ = (double)WVar18 == 7777.75;
        kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<double,double>&,double,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x12f,ERROR,
                   "\"failed: expected \" \"(7777.75) == (listReader[0])\", _kjCondition, 7777.75, listReader[0]"
                   ,(char (*) [46])"failed: expected (7777.75) == (listReader[0])",
                   (DebugComparison<double,_double> *)local_608,(double *)local_5d8,
                   (double *)&local_598);
      }
      dVar42 = *(double *)
                ((long)&(((WirePointer *)local_638)->offsetAndKind).value +
                (ulong)(uStack_630._4_4_ >> 3));
      local_5e8._0_1_ = INFINITY <= dVar42;
      local_608._0_4_ = 0x7f800000;
      WStack_600 = (WirePointer)dVar42;
      local_5f8 = (WirePointer *)0x28e598;
      local_5f0 = (WirePointer *)&DAT_00000005;
      auVar20 = local_638;
      if (kj::_::Debug::minSeverity < 3 && !local_5e8._0_1_) {
        local_598.segment._0_4_ = INFINITY;
        local_5d8 = (undefined1  [8])
                    *(char **)((long)&(((WirePointer *)local_638)->offsetAndKind).value +
                              (ulong)(uStack_630._4_4_ >> 3));
        kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x130,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                   ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                   (DebugComparison<float,_double> *)local_608,(float *)&local_598,
                   (double *)local_5d8);
        auVar20 = local_638;
      }
      dVar42 = *(double *)
                ((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                (ulong)(uStack_630._4_4_ >> 2));
      local_608._0_4_ = 0xff800000;
      WStack_600 = (WirePointer)dVar42;
      local_5f8 = (WirePointer *)0x28e598;
      local_5f0 = (WirePointer *)&DAT_00000005;
      local_5e8 = CONCAT31(local_5e8._1_3_,dVar42 <= -INFINITY);
      uVar7 = uStack_630._4_4_;
      if (kj::_::Debug::minSeverity < 3 && dVar42 > -INFINITY) {
        local_598.segment._0_4_ = -INFINITY;
        local_5d8 = (undefined1  [8])
                    *(char **)((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                              (ulong)(uStack_630._4_4_ >> 2));
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x131,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                   ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                   (DebugComparison<float,_double> *)local_608,(float *)&local_598,
                   (double *)local_5d8);
        auVar20 = local_638;
        uVar7 = uStack_630._4_4_;
      }
      bVar29 = NAN(*(double *)
                    ((long)&(((WirePointer *)auVar20)->offsetAndKind).value +
                    ((ulong)uVar7 * 3 >> 3)));
      local_608[0] = bVar29;
      if ((!bVar29) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x132,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                   (char (*) [38])"failed: expected isNaN(listReader[3])",
                   (DebugExpression<bool> *)local_608);
      }
      local_638 = (undefined1  [8])(in_stack_00000020 + 0xf);
      if (in_stack_0000002c < 0x10) {
        local_638 = (undefined1  [8])(WirePointer *)0x0;
      }
      local_648._0_4_ = in_stack_00000008;
      local_648._4_4_ = in_stack_0000000c;
      WStack_640.offsetAndKind.value = in_stack_00000010;
      WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
      uVar27 = _kjCondition._0_4_;
      if (in_stack_0000002c < 0x10) {
        uVar27._0_1_ = true;
        uVar27._1_1_ = true;
        uVar27._2_2_ = 0x7fff;
        local_648._0_4_ = 0.0;
        local_648._4_4_ = 0;
        WStack_640.offsetAndKind.value = 0;
        WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      }
      uStack_630._0_1_ = SUB41(uVar27,0);
      uStack_630._1_1_ = SUB41(uVar27,1);
      uStack_630._2_2_ = SUB42(uVar27,2);
      PointerReader::getList(&local_4e0,(PointerReader *)local_648,POINTER,(word *)0x0);
      local_648 = (undefined1  [8])0x29c5f9;
      WStack_640 = (WirePointer)0x6;
      local_638 = (undefined1  [8])0x294603;
      uStack_630 = (WirePointer *)0x6;
      local_628 = "thud";
      sStack_620 = 5;
      reader_24.reader.capTable = local_4e0.capTable;
      reader_24.reader.segment = local_4e0.segment;
      reader_24.reader.ptr = local_4e0.ptr;
      reader_24.reader.elementCount = local_4e0.elementCount;
      reader_24.reader.step = local_4e0.step;
      reader_24.reader.structDataSize = local_4e0.structDataSize;
      reader_24.reader.structPointerCount = local_4e0.structPointerCount;
      reader_24.reader.elementSize = local_4e0.elementSize;
      reader_24.reader._39_1_ = local_4e0._39_1_;
      reader_24.reader.nestingLimit = local_4e0.nestingLimit;
      reader_24.reader._44_4_ = local_4e0._44_4_;
      expected_23._M_len = 3;
      expected_23._M_array = (iterator)local_648;
      checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
                (reader_24,expected_23);
      local_638 = (undefined1  [8])(in_stack_00000020 + 0x10);
      uVar16._0_1_ = true;
      uVar16._1_1_ = true;
      uVar16._2_2_ = 0x7fff;
      local_648._0_4_ = in_stack_00000008;
      local_648._4_4_ = in_stack_0000000c;
      WStack_640.offsetAndKind.value = in_stack_00000010;
      WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
      uVar21 = _kjCondition._0_4_;
      if (in_stack_0000002c < 0x11) {
        local_648._0_4_ = 0.0;
        local_648._4_4_ = 0;
        WStack_640.offsetAndKind.value = 0;
        WStack_640.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        local_638 = (undefined1  [8])(WirePointer *)0x0;
        uVar21 = uVar16;
      }
      uStack_630._0_1_ = SUB41(uVar21,0);
      uStack_630._1_1_ = SUB41(uVar21,1);
      uStack_630._2_2_ = SUB42(uVar21,2);
      PointerReader::getList(&local_510,(PointerReader *)local_648,POINTER,(word *)0x0);
      local_648 = (undefined1  [8])0x2a571f;
      WStack_640 = (WirePointer)0x4;
      uStack_630 = (WirePointer *)0x9;
      local_638 = (undefined1  [8])anon_var_dwarf_b5bf4;
      local_628 = "rfc3092";
      sStack_620 = 7;
      reader_25.reader.capTable = local_510.capTable;
      reader_25.reader.segment = local_510.segment;
      reader_25.reader.ptr = local_510.ptr;
      reader_25.reader.elementCount = local_510.elementCount;
      reader_25.reader.step = local_510.step;
      reader_25.reader.structDataSize = local_510.structDataSize;
      reader_25.reader.structPointerCount = local_510.structPointerCount;
      reader_25.reader.elementSize = local_510.elementSize;
      reader_25.reader._39_1_ = local_510._39_1_;
      reader_25.reader.nestingLimit = local_510.nestingLimit;
      reader_25.reader._44_4_ = local_510._44_4_;
      expected_24._M_len = 3;
      expected_24._M_array = (iterator)local_648;
      checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
                (reader_25,expected_24);
      local_5f8 = (WirePointer *)0x0;
      iVar33 = 0x7fffffff;
      if (0x11 < in_stack_0000002c) {
        local_5f8 = in_stack_00000020 + 0x11;
        iVar33 = _kjCondition._0_4_;
      }
      local_608._0_4_ = 0.0;
      local_608._4_4_ = 0;
      WStack_600.offsetAndKind.value = 0;
      WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
      if (0x11 < in_stack_0000002c) {
        local_608._0_4_ = in_stack_00000008;
        local_608._4_4_ = in_stack_0000000c;
        WStack_600.offsetAndKind.value = in_stack_00000010;
        WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)in_stack_00000014;
      }
      local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
      PointerReader::getList
                ((ListReader *)local_648,(PointerReader *)local_608,INLINE_COMPOSITE,(word *)0x0);
      local_608._4_4_ = (ListElementCount)uStack_630;
      local_608._0_4_ = 3;
      WStack_600 = (WirePointer)" == ";
      local_5f8 = (WirePointer *)&DAT_00000005;
      local_5f0 = (WirePointer *)CONCAT71(local_5f0._1_7_,(ListElementCount)uStack_630 == 3);
      if ((ListElementCount)uStack_630 == 3) {
        local_568.segment = (SegmentReader *)0x2a50ca;
        ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,0);
        bVar29 = local_5b4 == 0;
        local_5f8 = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
        if (bVar29) {
          local_5f8 = (WirePointer *)0x0;
        }
        iVar33 = 0x7fffffff;
        if (!bVar29) {
          iVar33 = local_5b0;
        }
        local_608._0_4_ = 0;
        local_608._4_4_ = 0;
        WStack_600.offsetAndKind.value = 0;
        WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        if (!bVar29) {
          local_608._0_4_ = local_5d8._0_4_;
          local_608._4_4_ = local_5d8._4_4_;
          WStack_600.offsetAndKind.value = uStack_5d0._0_4_;
          WStack_600.field_1 = uStack_5d0._4_4_;
        }
        local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
        local_598._0_16_ =
             PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
        kj::_::DebugExpression<char_const(&)[13]>::operator==
                  ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                   (DebugExpression<char_const(&)[13]> *)&local_568,(Reader *)&local_598);
        if ((local_5e0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
          ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,0);
          bVar29 = local_5b4 == 0;
          local_598.data = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
          if (bVar29) {
            local_598.data = (WirePointer *)0x0;
          }
          local_598.pointers._0_4_ = 0x7fffffff;
          if (!bVar29) {
            local_598.pointers._0_4_ = local_5b0;
          }
          local_598.segment._0_4_ = (float)0;
          local_598.segment._4_4_ = 0;
          local_598.capTable._0_4_ = 0;
          local_598.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
          if (!bVar29) {
            local_598.segment._0_4_ = (float)local_5d8._0_4_;
            local_598.segment._4_4_ = local_5d8._4_4_;
            local_598.capTable._0_4_ = uStack_5d0._0_4_;
            local_598.capTable._4_4_ = uStack_5d0._4_4_;
          }
          local_598._0_16_ =
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
          kj::_::Debug::
          log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x139,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"structlist 1\", listReader[0].getTextField()"
                     ,(char (*) [68])
                      "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
                     (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                     (char (*) [13])0x2a50ca,(Reader *)&local_598);
        }
        local_568.segment = (SegmentReader *)0x29558c;
        ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,1);
        bVar29 = local_5b4 == 0;
        local_5f8 = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
        if (bVar29) {
          local_5f8 = (WirePointer *)0x0;
        }
        iVar33 = 0x7fffffff;
        if (!bVar29) {
          iVar33 = local_5b0;
        }
        local_608._0_4_ = 0;
        local_608._4_4_ = 0;
        WStack_600.offsetAndKind.value = 0;
        WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        if (!bVar29) {
          local_608._0_4_ = local_5d8._0_4_;
          local_608._4_4_ = local_5d8._4_4_;
          WStack_600.offsetAndKind.value = uStack_5d0._0_4_;
          WStack_600.field_1 = uStack_5d0._4_4_;
        }
        local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
        local_598._0_16_ =
             PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
        kj::_::DebugExpression<char_const(&)[13]>::operator==
                  ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                   (DebugExpression<char_const(&)[13]> *)&local_568,(Reader *)&local_598);
        if ((local_5e0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
          ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,1);
          bVar29 = local_5b4 == 0;
          local_598.data = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
          if (bVar29) {
            local_598.data = (WirePointer *)0x0;
          }
          local_598.pointers._0_4_ = 0x7fffffff;
          if (!bVar29) {
            local_598.pointers._0_4_ = local_5b0;
          }
          local_598.segment._0_4_ = (float)0;
          local_598.segment._4_4_ = 0;
          local_598.capTable._0_4_ = 0;
          local_598.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
          if (!bVar29) {
            local_598.segment._0_4_ = (float)local_5d8._0_4_;
            local_598.segment._4_4_ = local_5d8._4_4_;
            local_598.capTable._0_4_ = uStack_5d0._0_4_;
            local_598.capTable._4_4_ = uStack_5d0._4_4_;
          }
          local_598._0_16_ =
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
          kj::_::Debug::
          log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x13a,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"structlist 2\", listReader[1].getTextField()"
                     ,(char (*) [68])
                      "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
                     (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                     (char (*) [13])0x29558c,(Reader *)&local_598);
        }
        local_568.segment = (SegmentReader *)"structlist 3";
        ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,2);
        bVar29 = local_5b4 == 0;
        local_5f8 = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
        if (bVar29) {
          local_5f8 = (WirePointer *)0x0;
        }
        iVar33 = 0x7fffffff;
        if (!bVar29) {
          iVar33 = local_5b0;
        }
        local_608._0_4_ = 0;
        local_608._4_4_ = 0;
        WStack_600.offsetAndKind.value = 0;
        WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
        if (!bVar29) {
          local_608._0_4_ = local_5d8._0_4_;
          local_608._4_4_ = local_5d8._4_4_;
          WStack_600.offsetAndKind.value = uStack_5d0._0_4_;
          WStack_600.field_1 = uStack_5d0._4_4_;
        }
        local_5f0 = (WirePointer *)CONCAT44(local_5f0._4_4_,iVar33);
        local_598._0_16_ =
             PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
        kj::_::DebugExpression<char_const(&)[13]>::operator==
                  ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                   (DebugExpression<char_const(&)[13]> *)&local_568,(Reader *)&local_598);
        if ((local_5e0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
          ListReader::getStructElement((StructReader *)local_5d8,(ListReader *)local_648,2);
          bVar29 = local_5b4 == 0;
          local_598.data = (WirePointer *)CONCAT44(uStack_5bc,local_5c0);
          if (bVar29) {
            local_598.data = (WirePointer *)0x0;
          }
          local_598.pointers._0_4_ = 0x7fffffff;
          if (!bVar29) {
            local_598.pointers._0_4_ = local_5b0;
          }
          local_598.segment._0_4_ = (float)0;
          local_598.segment._4_4_ = 0;
          local_598.capTable._0_4_ = 0;
          local_598.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0;
          if (!bVar29) {
            local_598.segment._0_4_ = (float)local_5d8._0_4_;
            local_598.segment._4_4_ = local_5d8._4_4_;
            local_598.capTable._0_4_ = uStack_5d0._0_4_;
            local_598.capTable._4_4_ = uStack_5d0._4_4_;
          }
          local_598._0_16_ =
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
          kj::_::Debug::
          log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x13b,ERROR,
                     "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"structlist 3\", listReader[2].getTextField()"
                     ,(char (*) [68])
                      "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
                     (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_608,
                     (char (*) [13])0x2a528a,(Reader *)&local_598);
        }
        local_638 = (undefined1  [8])(in_stack_00000020 + 0x12);
        if (in_stack_0000002c < 0x13) {
          local_638 = (undefined1  [8])(WirePointer *)0x0;
        }
        uVar28._0_1_ = true;
        uVar28._1_1_ = true;
        uVar28._2_2_ = 0x7fff;
        if (in_stack_0000002c < 0x13) {
          in_stack_00000008 = 0.0;
          in_stack_0000000c = 0;
          in_stack_00000010 = 0;
          in_stack_00000014 = 0;
          _kjCondition._0_4_ = uVar28;
        }
        WStack_640.field_1.upper32Bits = in_stack_00000014;
        WStack_640.offsetAndKind.value = in_stack_00000010;
        uStack_630._0_1_ = _kjCondition.left;
        uStack_630._1_1_ = _kjCondition.right;
        uStack_630._2_2_ = _kjCondition._2_2_;
        local_648._0_4_ = in_stack_00000008;
        local_648._4_4_ = in_stack_0000000c;
        PointerReader::getList(&local_540,(PointerReader *)local_648,TWO_BYTES,(word *)0x0);
        local_648._0_4_ = 0x70000;
        reader_26.reader.capTable = local_540.capTable;
        reader_26.reader.segment = local_540.segment;
        reader_26.reader.ptr = local_540.ptr;
        reader_26.reader.elementCount = local_540.elementCount;
        reader_26.reader.step = local_540.step;
        reader_26.reader.structDataSize = local_540.structDataSize;
        reader_26.reader.structPointerCount = local_540.structPointerCount;
        reader_26.reader.elementSize = local_540.elementSize;
        reader_26.reader._39_1_ = local_540._39_1_;
        reader_26.reader.nestingLimit = local_540.nestingLimit;
        reader_26.reader._44_4_ = local_540._44_4_;
        expected_25._M_len = 2;
        expected_25._M_array = (iterator)local_648;
        checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
                  (reader_26,expected_25);
        return;
      }
      local_598.segment._0_4_ = 4.2039e-45;
      local_568.segment._0_4_ = (float)(ListElementCount)uStack_630;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ((Fault *)local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x138,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_608,(uint *)&local_598,
                 (uint *)&local_568);
      kj::_::Debug::Fault::fatal((Fault *)local_5d8);
    }
    local_598.segment._0_4_ = 5.60519e-45;
    local_568.segment._0_4_ = (float)(ListElementCount)uStack_630;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12e,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_608,(uint *)&local_598,
               (uint *)&local_568);
    kj::_::Debug::Fault::fatal((Fault *)local_5d8);
  }
  local_598.segment._0_4_ = 5.60519e-45;
  local_568.segment._0_4_ = (float)(ListElementCount)uStack_630;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)local_5d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x126,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_608,(uint *)&local_598,
             (uint *)&local_568);
  kj::_::Debug::Fault::fatal((Fault *)local_5d8);
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}